

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int ptls_openssl_encrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  HMAC_CTX *ctx;
  int iVar1;
  int iVar2;
  EVP_CIPHER_CTX *a;
  long lVar3;
  uchar *puVar4;
  int clen;
  int local_44;
  HMAC_CTX *local_40;
  uchar *local_38;
  
  a = EVP_CIPHER_CTX_new();
  iVar1 = 0x201;
  if (a != (EVP_CIPHER_CTX *)0x0) {
    local_40 = (HMAC_CTX *)HMAC_CTX_new();
    if (local_40 == (HMAC_CTX *)0x0) {
      EVP_CIPHER_CTX_free(a);
    }
    else {
      iVar1 = ptls_buffer_reserve(buf,src.len + 0x80);
      if (iVar1 == 0) {
        local_38 = buf->base + buf->off;
        iVar2 = (*cb)(local_38,buf->base + buf->off + 0x10,(EVP_CIPHER_CTX *)a,(HMAC_CTX *)local_40,
                      1);
        iVar1 = 0x203;
        if (iVar2 != 0) {
          puVar4 = local_38 + 0x20;
          iVar2 = EVP_EncryptUpdate(a,puVar4,&local_44,src.base,(int)src.len);
          if (iVar2 != 0) {
            lVar3 = (long)local_44;
            iVar2 = EVP_EncryptFinal_ex(a,puVar4 + lVar3,&local_44);
            ctx = local_40;
            if (iVar2 != 0) {
              puVar4 = puVar4 + lVar3 + local_44;
              iVar2 = HMAC_Update(local_40,buf->base + buf->off,
                                  (long)puVar4 - (long)(buf->base + buf->off));
              if (iVar2 != 0) {
                iVar2 = HMAC_Final(ctx,puVar4,(uint *)0x0);
                if (iVar2 != 0) {
                  lVar3 = HMAC_size(local_40);
                  if (buf->base + buf->capacity < puVar4 + lVar3) {
                    __assert_fail("dst <= buf->base + buf->capacity",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                                  ,0x5bf,
                                  "int ptls_openssl_encrypt_ticket(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, HMAC_CTX *, int))"
                                 );
                  }
                  buf->off = (long)(puVar4 + lVar3) - (long)buf->base;
                  iVar1 = 0;
                }
              }
            }
          }
        }
      }
      EVP_CIPHER_CTX_free(a);
      HMAC_CTX_free(local_40);
    }
  }
  return iVar1;
}

Assistant:

int ptls_openssl_encrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!HMAC_Update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) || !HMAC_Final(hctx, dst, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += HMAC_size(hctx);

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}